

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint.hpp
# Opt level: O1

int __thiscall protozero::pbf_reader::get_varint<int>(pbf_reader *this)

{
  char cVar1;
  char *pcVar2;
  uint64_t val;
  uint64_t uVar3;
  
  pcVar2 = this->m_data;
  if (pcVar2 != this->m_end) {
    cVar1 = *pcVar2;
    if (-1 < cVar1) {
      this->m_data = pcVar2 + 1;
      return (int)cVar1;
    }
  }
  uVar3 = detail::decode_varint_impl(&this->m_data,this->m_end);
  return (int)uVar3;
}

Assistant:

inline uint64_t decode_varint(const char** data, const char* end) {
    // If this is a one-byte varint, decode it here.
    if (end != *data && ((static_cast<uint64_t>(**data) & 0x80U) == 0)) {
        const auto val = static_cast<uint64_t>(**data);
        ++(*data);
        return val;
    }
    // If this varint is more than one byte, defer to complete implementation.
    return detail::decode_varint_impl(data, end);
}